

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_NtkGetBddNodeNum(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj;
  int local_30;
  int local_24;
  int i;
  Abc_Obj_t *pNode;
  int nNodes;
  Abc_Ntk_t *pNtk_local;
  
  pNode._4_4_ = 0;
  iVar1 = Abc_NtkIsBddLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsBddLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0xfc,"int Abc_NtkGetBddNodeNum(Abc_Ntk_t *)");
  }
  local_24 = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= local_24) {
      return pNode._4_4_;
    }
    pObj = Abc_NtkObj(pNtk,local_24);
    if ((pObj != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj), iVar1 != 0)) {
      if ((pObj->field_5).pData == (void *)0x0) {
        __assert_fail("pNode->pData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                      ,0xff,"int Abc_NtkGetBddNodeNum(Abc_Ntk_t *)");
      }
      iVar1 = Abc_ObjFaninNum(pObj);
      if (1 < iVar1) {
        if ((pObj->field_5).pData == (void *)0x0) {
          local_30 = 0;
        }
        else {
          local_30 = Cudd_DagSize((DdNode *)(pObj->field_5).pData);
          local_30 = local_30 + -1;
        }
        pNode._4_4_ = local_30 + pNode._4_4_;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

int Abc_NtkGetBddNodeNum( Abc_Ntk_t * pNtk )
{
    int nNodes = 0;
#ifdef ABC_USE_CUDD
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsBddLogic(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        assert( pNode->pData );
        if ( Abc_ObjFaninNum(pNode) < 2 )
            continue;
        nNodes += pNode->pData? -1 + Cudd_DagSize( (DdNode *)pNode->pData ) : 0;
    }
#endif
    return nNodes;
}